

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O1

void __thiscall dxil_spv::CFGStructurizer::backwards_visit(CFGStructurizer *this)

{
  uint uVar1;
  uint uVar2;
  pointer ppCVar3;
  CFGNode *pCVar4;
  CFGNode *pCVar5;
  long lVar6;
  iterator iVar7;
  bool bVar8;
  ulong uVar9;
  CFGNode *pCVar10;
  pointer ppCVar11;
  Vector<CFGNode_*> *__range5;
  long lVar12;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  __node_base _Var13;
  long lVar14;
  CFGNode **ppCVar15;
  CFGNode **ppCVar16;
  Vector<CFGNode_*> exits;
  Vector<CFGNode_*> leaf_nodes;
  CFGNode *exit_node;
  CFGNode *node;
  LoopBacktracer tracer;
  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> local_128;
  CFGNode **local_108;
  iterator iStack_100;
  CFGNode **local_f8;
  CFGStructurizer *local_f0;
  CFGNode *local_e8;
  LoopMergeTracer local_e0;
  _Alloc_hider local_68;
  size_type local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  void *local_40;
  pointer pPStack_38;
  
  local_108 = (CFGNode **)0x0;
  iStack_100._M_current = (CFGNode **)0x0;
  local_f8 = (CFGNode **)0x0;
  ppCVar11 = (this->forward_post_visit_order).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppCVar3 = (this->forward_post_visit_order).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar15 = local_108;
  iVar7._M_current = iStack_100._M_current;
  if (ppCVar11 != ppCVar3) {
    do {
      local_e0.backtracer = (LoopBacktracer *)*ppCVar11;
      ((CFGNode *)local_e0.backtracer)->backward_visited = false;
      ((CFGNode *)local_e0.backtracer)->traversing = false;
      if (((((CFGNode *)local_e0.backtracer)->succ).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (((CFGNode *)local_e0.backtracer)->succ).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (((CFGNode *)local_e0.backtracer)->succ_back_edge == (CFGNode *)0x0)) {
        if (iStack_100._M_current == local_f8) {
          std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
          _M_realloc_insert<dxil_spv::CFGNode*const&>
                    ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                      *)&local_108,iStack_100,(CFGNode **)&local_e0);
        }
        else {
          *iStack_100._M_current = (CFGNode *)local_e0.backtracer;
          iStack_100._M_current = iStack_100._M_current + 1;
        }
      }
      ppCVar11 = ppCVar11 + 1;
      ppCVar15 = local_108;
      iVar7._M_current = iStack_100._M_current;
    } while (ppCVar11 != ppCVar3);
  }
  for (; ppCVar15 != iVar7._M_current; ppCVar15 = ppCVar15 + 1) {
    backwards_visit(this,*ppCVar15);
  }
  lVar12 = (long)(this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->forward_post_visit_order).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    bVar8 = false;
    local_f0 = this;
    do {
      pCVar4 = (this->forward_post_visit_order).
               super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12 + -1];
      pCVar10 = pCVar4->pred_back_edge;
      if ((pCVar10 != (CFGNode *)0x0) && (pCVar10->backward_visited == false)) {
        local_68._M_p = (pointer)&stack0xffffffffffffffc8;
        local_60 = 1;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 1.0;
        local_40 = (void *)0x0;
        pPStack_38 = (pointer)0x0;
        LoopBacktracer::trace_to_parent((LoopBacktracer *)&stack0xffffffffffffff98,pCVar4,pCVar10);
        local_e0.loop_exits._M_h._M_buckets = &local_e0.loop_exits._M_h._M_single_bucket;
        local_e0.loop_exits._M_h._M_bucket_count = 1;
        local_e0.loop_exits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_e0.loop_exits._M_h._M_element_count = 0;
        local_e0.loop_exits._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_e0.loop_exits._M_h._M_rehash_policy._M_next_resize = 0;
        local_e0.loop_exits._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_e0.traced_blocks._M_h._M_buckets = &local_e0.traced_blocks._M_h._M_single_bucket;
        local_e0.traced_blocks._M_h._M_bucket_count = 1;
        local_e0.traced_blocks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_e0.traced_blocks._M_h._M_element_count = 0;
        local_e0.traced_blocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_e0.traced_blocks._M_h._M_rehash_policy._M_next_resize = 0;
        local_e0.traced_blocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_e0.backtracer = (LoopBacktracer *)&stack0xffffffffffffff98;
        LoopMergeTracer::trace_from_parent(&local_e0,pCVar4);
        local_128.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (CFGNode **)0x0;
        local_128.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (CFGNode **)0x0;
        local_128.
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (CFGNode **)0x0;
        std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
        reserve(&local_128,local_e0.loop_exits._M_h._M_element_count);
        for (_Var13._M_nxt = local_e0.loop_exits._M_h._M_before_begin._M_nxt; this = local_f0,
            ppCVar3 = local_128.
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            ppCVar11 = local_128.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
            _Var13._M_nxt != (_Hash_node_base *)0x0; _Var13._M_nxt = (_Var13._M_nxt)->_M_nxt) {
          local_e8 = (CFGNode *)_Var13._M_nxt[1]._M_nxt;
          if (local_128.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_128.
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
            _M_realloc_insert<dxil_spv::CFGNode*const&>
                      ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                        *)&local_128,
                       (iterator)
                       local_128.
                       super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_e8);
          }
          else {
            *local_128.
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = local_e8;
            local_128.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_128.
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        if (local_128.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_128.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar14 = (long)local_128.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_128.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = lVar14 >> 3;
          lVar6 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::backwards_visit()::__0>>
                    (local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
          if (lVar14 < 0x81) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::backwards_visit()::__0>>
                      (ppCVar11,ppCVar3);
          }
          else {
            ppCVar15 = ppCVar11 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::backwards_visit()::__0>>
                      (ppCVar11,ppCVar15);
            for (; ppCVar15 != ppCVar3; ppCVar15 = ppCVar15 + 1) {
              pCVar10 = ppCVar15[-1];
              pCVar5 = *ppCVar15;
              uVar2 = pCVar5->forward_post_visit_order;
              uVar1 = pCVar10->forward_post_visit_order;
              ppCVar16 = ppCVar15;
              while (uVar1 < uVar2) {
                *ppCVar16 = pCVar10;
                pCVar10 = ppCVar16[-2];
                ppCVar16 = ppCVar16 + -1;
                uVar1 = pCVar10->forward_post_visit_order;
              }
              *ppCVar16 = pCVar5;
            }
          }
        }
        ppCVar16 = local_128.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar15 = local_128.
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)local_128.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_128.
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_start == 8) {
          pCVar10 = *local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          bVar8 = CFGNode::dominates_all_reachable_exits(pCVar10);
          if (bVar8) {
            pCVar10 = get_innermost_loop_header_for(this,pCVar4,pCVar10);
            bVar8 = pCVar10 == pCVar4;
          }
          ppCVar11 = local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          ppCVar16 = local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar15 = local_128.
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (bVar8 == false) goto LAB_0013b795;
          for (; ppCVar16 != ppCVar11; ppCVar16 = ppCVar16 + 1) {
            CFGNode::add_branch(pCVar4->pred_back_edge,*ppCVar16);
          }
        }
        else {
LAB_0013b795:
          for (; ppCVar16 != ppCVar15; ppCVar16 = ppCVar16 + 1) {
            pCVar10 = *ppCVar16;
            bVar8 = CFGNode::reaches_backward_visited_node(pCVar10);
            if (bVar8) {
              CFGNode::add_fake_branch(pCVar4->pred_back_edge,pCVar10);
            }
          }
        }
        pCVar4 = pCVar4->pred_back_edge;
        if (((pCVar4->succ).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pCVar4->succ).
             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) ||
           ((pCVar4->fake_succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pCVar4->fake_succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          pCVar4->backward_visited = true;
        }
        if (local_128.
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (CFGNode **)0x0) {
          free_in_thread(local_128.
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_e0.traced_blocks._M_h);
        std::
        _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_e0.loop_exits._M_h);
        std::
        _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)&stack0xffffffffffffff98);
        bVar8 = true;
      }
      iVar7._M_current = iStack_100._M_current;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    if (bVar8) {
      ppCVar3 = (this->forward_post_visit_order).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar11 = (this->forward_post_visit_order).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar15 = local_108,
          ppCVar11 != ppCVar3; ppCVar11 = ppCVar11 + 1) {
        pCVar4 = *ppCVar11;
        pCVar4->backward_visited = false;
        pCVar4->traversing = false;
        pCVar4->backward_post_visit_order = 0;
      }
      for (; ppCVar15 != iVar7._M_current; ppCVar15 = ppCVar15 + 1) {
        backwards_visit(this,*ppCVar15);
      }
    }
  }
  pCVar4 = this->exit_block;
  pCVar4->backward_post_visit_order =
       (uint32_t)
       ((ulong)((long)(this->backward_post_visit_order).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->backward_post_visit_order).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  pCVar4->immediate_post_dominator = pCVar4;
  pCVar4->backward_visited = true;
  for (ppCVar15 = local_108; ppCVar15 != iStack_100._M_current; ppCVar15 = ppCVar15 + 1) {
    (*ppCVar15)->immediate_post_dominator = pCVar4;
  }
  if (local_108 != (CFGNode **)0x0) {
    free_in_thread(local_108);
  }
  return;
}

Assistant:

void CFGStructurizer::backwards_visit()
{
	Vector<CFGNode *> leaf_nodes;

	// Traverse from leaf nodes, back through their preds instead.
	// Clear out some state set by forward visit earlier.
	for (auto *node : forward_post_visit_order)
	{
		node->backward_visited = false;
		node->traversing = false;

		// For loops which can only exit from their header block,
		// certain loops will be unreachable when doing a backwards traversal.
		// We'll visit them explicitly later.
		if (node->succ.empty() && !node->succ_back_edge)
			leaf_nodes.push_back(node);
	}

	for (auto *leaf : leaf_nodes)
		backwards_visit(*leaf);

	// It might be case that some continue blocks are not reachable through backwards traversal.
	// This effectively means that our flipped CFG is not reducible, which is rather annoying.
	// To work around this, we fake some branches from the continue block out to other blocks.
	// This way, we ensure that every forward-reachable block is reachable in a backwards traversal as well.
	// The algorithm works where given the innermost loop header A, a block B (A dom B) and continue block C,
	// For successors of B, we will observe some successors which can reach C ({E}), and some successors which can not reach C.
	// C will add fake successor edges to {E}.
	bool need_revisit = false;
	for (size_t i = forward_post_visit_order.size(); i; i--)
	{
		// Resolve outer loops before inner loops since we can have nested loops which need
		// to link into each other.
		auto *node = forward_post_visit_order[i - 1];

		if (node->pred_back_edge)
		{
			if (!node->pred_back_edge->backward_visited)
			{
				LoopBacktracer tracer;
				tracer.trace_to_parent(node, node->pred_back_edge);
				LoopMergeTracer merge_tracer(tracer);
				merge_tracer.trace_from_parent(node);

				// If we have an infinite loop, the continue block will not be reachable with backwards traversal.
				// Also, the only way to exit the loop construct could be through a single return block.
				// In this case, the return block should be moved and considered to be the merge block.
				// We add true branches from the continue block to return block instead of fake branches.

				// Ensure stable codegen order.
				Vector<CFGNode *> exits;
				exits.reserve(merge_tracer.loop_exits.size());
				for (auto *exit_node : merge_tracer.loop_exits)
					exits.push_back(exit_node);
				std::sort(exits.begin(), exits.end(), [](const CFGNode *a, const CFGNode *b) {
					return a->forward_post_visit_order > b->forward_post_visit_order;
				});

				bool transpose_loop_exit = false;
				if (exits.size() == 1)
				{
					auto *exit_node = exits.front();
					// If this is true, we never really leave the loop, which is problematic.
					transpose_loop_exit = exit_node->dominates_all_reachable_exits();

					// Only transpose if we're the innermost header, otherwise, inner loops which try to branch
					// to the return will be considered a multi-break which is very awkward.
					if (transpose_loop_exit)
					{
						auto *innermost_header = get_innermost_loop_header_for(node, exit_node);
						transpose_loop_exit = innermost_header == node;
					}
				}

				if (transpose_loop_exit)
				{
					for (auto *f : exits)
						node->pred_back_edge->add_branch(f);
				}
				else
				{
					// Only consider exits that are themselves backwards reachable.
					// Otherwise, we'll be adding fake succs that resolve to outer infinite loops again.
					for (auto *f : exits)
						if (f->reaches_backward_visited_node())
							node->pred_back_edge->add_fake_branch(f);
				}

				if (!node->pred_back_edge->succ.empty() ||
				    !node->pred_back_edge->fake_succ.empty())
				{
					// Consider this to be backwards visited in case we have a nested inner loop
					// that needs to link up to node->pred_back_edge.
					node->pred_back_edge->backward_visited = true;
				}

				need_revisit = true;
			}
		}
	}

	if (need_revisit)
	{
		for (auto *node : forward_post_visit_order)
		{
			node->backward_visited = false;
			node->traversing = false;
			node->backward_post_visit_order = 0;
		}

		for (auto *leaf : leaf_nodes)
			backwards_visit(*leaf);
	}

	exit_block->backward_post_visit_order = backward_post_visit_order.size();
	exit_block->immediate_post_dominator = exit_block;
	exit_block->backward_visited = true;
	for (auto *leaf : leaf_nodes)
		leaf->immediate_post_dominator = exit_block;
}